

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Options.h
# Opt level: O3

void __thiscall
Minisat::StringOption::printOptions(StringOption *this,FILE *pcsFile,int granularity)

{
  int iVar1;
  char *pcVar2;
  
  pcVar2 = strstr((this->super_Option).name,"debug");
  if (pcVar2 == (char *)0x0) {
    pcVar2 = strstr((this->super_Option).description,"debug");
    if (pcVar2 == (char *)0x0) {
      iVar1 = (*(this->super_Option)._vptr_Option[10])(this);
      if (((char)iVar1 != '\0') && (this->defaultValue != (char *)0x0)) {
        fprintf((FILE *)pcsFile,"%s  {\"\",%s} [%s]     # %s\n",(this->super_Option).name,
                this->defaultValue,(this->value->_M_dataplus)._M_p,(this->super_Option).description)
        ;
        return;
      }
    }
  }
  return;
}

Assistant:

void printOptions(FILE *pcsFile, int granularity)
    {

        if (strstr(name, "debug") != 0 || strstr(description, "debug") != 0) {
            return;
        } // do not print the parameter, if its related to debug output
        if (!wouldPrintOption()) {
            return;
        } // do not print option?

        // print only, if there is a default
        if (defaultValue != 0) {
            fprintf(pcsFile, "%s  {\"\",%s} [%s]     # %s\n", name, defaultValue, value->c_str(), description);
        }
    }